

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O1

int run_test_we_get_signal(void)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar4;
  long lVar5;
  int iVar6;
  undefined4 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *handle;
  undefined4 uVar7;
  int signum;
  uv__queue **ppuVar8;
  anon_union_8_2_bf76bca6_for_active_reqs *loop;
  uv_signal_t *handle_00;
  uv_handle_t *puVar9;
  signal_ctx *ctx;
  uv_signal_t *handle_01;
  int64_t eval_b;
  int64_t eval_a;
  timer_ctx tc;
  signal_ctx sc;
  undefined1 auStack_930 [144];
  undefined1 auStack_8a0 [136];
  undefined1 auStack_818 [136];
  undefined1 auStack_790 [136];
  signal_ctx sStack_708;
  uv_loop_t *puStack_678;
  void *pvStack_628;
  undefined1 auStack_620 [144];
  signal_ctx sStack_590;
  uv_loop_t *puStack_508;
  timer_ctx *ptStack_500;
  ulong uStack_4f8;
  ulong uStack_4f0;
  timer_ctx tStack_4e8;
  timer_ctx tStack_460;
  signal_ctx sStack_3d8;
  signal_ctx sStack_350;
  signal_ctx sStack_2c8;
  signal_ctx sStack_240;
  ulong uStack_1b8;
  uv_signal_t *puStack_1b0;
  code *pcStack_1a8;
  long lStack_198;
  code *pcStack_190;
  undefined8 uStack_180;
  void *pvStack_178;
  uv_loop_t *puStack_170;
  signal_ctx *psStack_168;
  uv__queue *puStack_150;
  undefined1 auStack_148 [8];
  undefined8 uStack_140;
  uv__queue *local_130;
  anon_union_8_2_bf76bca6_for_active_reqs local_128;
  timer_ctx local_120;
  signal_ctx local_98;
  
  uStack_140._0_4_ = 0x1b9839;
  uStack_140._4_4_ = 0;
  puVar4 = uv_default_loop();
  uStack_140._0_4_ = 0x1b984e;
  uStack_140._4_4_ = 0;
  start_timer(puVar4,0x11,&local_120);
  ctx = &local_98;
  iVar6 = 0;
  uStack_140._0_4_ = 0x1b9868;
  uStack_140._4_4_ = 0;
  start_watcher(puVar4,0x11,ctx,0);
  local_98.stop_or_close = STOP;
  uStack_140._0_4_ = 0x1b9879;
  uStack_140._4_4_ = 0;
  iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
  local_128 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar2;
  local_130 = (uv__queue *)0x0;
  if (local_128.unused == (void *)0x0) {
    local_128._4_4_ = 0;
    local_128.count = local_120.ncalls;
    local_130 = (uv__queue *)0xa;
    if (local_128.unused != (void *)0xa) goto LAB_001b9a66;
    local_128._4_4_ = 0;
    local_128.count = local_98.ncalls;
    local_130 = (uv__queue *)0xa;
    if (local_128.unused != (void *)0xa) goto LAB_001b9a75;
    uStack_140._0_4_ = 0x1b98f2;
    uStack_140._4_4_ = 0;
    start_timer(puVar4,0x11,&local_120);
    uStack_140._0_4_ = 0x1b98fc;
    uStack_140._4_4_ = 0;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    local_128 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar2;
    local_130 = (uv__queue *)0x0;
    if (local_128.unused != (void *)0x0) goto LAB_001b9a84;
    local_128._4_4_ = 0;
    local_128.count = local_120.ncalls;
    local_130 = (uv__queue *)0xa;
    if (local_128.unused != (void *)0xa) goto LAB_001b9a93;
    local_128._4_4_ = 0;
    local_128.count = local_98.ncalls;
    local_130 = (uv__queue *)0xa;
    if (local_128.unused != (void *)0xa) goto LAB_001b9aa2;
    ctx = (signal_ctx *)0x0;
    local_98.stop_or_close = CLOSE;
    local_98.ncalls = 0;
    uStack_140._0_4_ = 0x1b9983;
    uStack_140._4_4_ = 0;
    uv_signal_start(&local_98.handle,signal_cb,0x11);
    uStack_140._0_4_ = 0x1b9995;
    uStack_140._4_4_ = 0;
    start_timer(puVar4,0x11,&local_120);
    uStack_140._0_4_ = 0x1b999f;
    uStack_140._4_4_ = 0;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    local_128 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar2;
    local_130 = (uv__queue *)0x0;
    if (local_128.unused != (void *)0x0) goto LAB_001b9ab1;
    local_128._4_4_ = 0;
    local_128.count = local_120.ncalls;
    local_130 = (uv__queue *)0xa;
    if (local_128.unused != (void *)0xa) goto LAB_001b9ac0;
    local_128._4_4_ = 0;
    local_128.count = local_98.ncalls;
    local_130 = (uv__queue *)0xa;
    if (local_128.unused != (void *)0xa) goto LAB_001b9acf;
    uStack_140._0_4_ = 0x1b9a13;
    uStack_140._4_4_ = 0;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uStack_140._0_4_ = 0x1b9a1d;
    uStack_140._4_4_ = 0;
    uv_run(puVar4,UV_RUN_DEFAULT);
    local_128.unused = (void *)0x0;
    uStack_140._0_4_ = 0x1b9a2e;
    uStack_140._4_4_ = 0;
    iVar2 = uv_loop_close(puVar4);
    local_130 = (uv__queue *)(long)iVar2;
    if ((uv__queue *)local_128.unused == local_130) {
      uStack_140._0_4_ = 0x1b9a4a;
      uStack_140._4_4_ = 0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_140._0_4_ = 0x1b9a66;
    uStack_140._4_4_ = 0;
    run_test_we_get_signal_cold_1();
LAB_001b9a66:
    uStack_140._0_4_ = 0x1b9a75;
    uStack_140._4_4_ = 0;
    run_test_we_get_signal_cold_2();
LAB_001b9a75:
    uStack_140._0_4_ = 0x1b9a84;
    uStack_140._4_4_ = 0;
    run_test_we_get_signal_cold_3();
LAB_001b9a84:
    uStack_140._0_4_ = 0x1b9a93;
    uStack_140._4_4_ = 0;
    run_test_we_get_signal_cold_4();
LAB_001b9a93:
    uStack_140._0_4_ = 0x1b9aa2;
    uStack_140._4_4_ = 0;
    run_test_we_get_signal_cold_5();
LAB_001b9aa2:
    uStack_140._0_4_ = 0x1b9ab1;
    uStack_140._4_4_ = 0;
    run_test_we_get_signal_cold_6();
LAB_001b9ab1:
    uStack_140._0_4_ = 0x1b9ac0;
    uStack_140._4_4_ = 0;
    run_test_we_get_signal_cold_7();
LAB_001b9ac0:
    uStack_140._0_4_ = 0x1b9acf;
    uStack_140._4_4_ = 0;
    run_test_we_get_signal_cold_8();
LAB_001b9acf:
    uStack_140._0_4_ = 0x1b9ade;
    uStack_140._4_4_ = 0;
    run_test_we_get_signal_cold_9();
  }
  loop = &local_128;
  uVar7 = SUB84(&local_130,0);
  uStack_140 = start_timer;
  run_test_we_get_signal_cold_10();
  ppuVar8 = &puStack_150;
  *extraout_RDX = 0;
  extraout_RDX[0x20] = uVar7;
  handle = (uv_loop_t *)(extraout_RDX + 2);
  uStack_140 = (code *)puVar4;
  iVar2 = uv_timer_init((uv_loop_t *)loop,(uv_timer_t *)handle);
  auStack_148 = (undefined1  [8])(long)iVar2;
  puStack_150 = (uv__queue *)0x0;
  if (auStack_148 == (undefined1  [8])0x0) {
    iVar6 = 5;
    iVar2 = uv_timer_start((uv_timer_t *)handle,timer_cb,5,5);
    auStack_148 = (undefined1  [8])(long)iVar2;
    puStack_150 = (uv__queue *)0x0;
    if (auStack_148 == (undefined1  [8])0x0) {
      return iVar2;
    }
  }
  else {
    start_timer_cold_1();
  }
  puVar4 = (uv_loop_t *)auStack_148;
  start_timer_cold_2();
  signum = (int)ppuVar8;
  *(int *)(extraout_RDX_00 + 0x10) = signum;
  *extraout_RDX_00 = 0;
  *(int *)((long)extraout_RDX_00 + 0x84) = iVar6;
  handle_01 = (uv_signal_t *)(extraout_RDX_00 + 1);
  pcStack_190 = (code *)0x1b9ba9;
  puStack_170 = handle;
  psStack_168 = ctx;
  iVar2 = uv_signal_init(puVar4,handle_01);
  pvStack_178 = (void *)(long)iVar2;
  uStack_180 = 0;
  if (pvStack_178 == (void *)0x0) {
    pvVar1 = (void *)0x0;
    if (iVar6 != 0) {
      pcStack_190 = (code *)0x1b9bd6;
      iVar2 = uv_signal_start_oneshot(handle_01,signal_cb_one_shot,signum);
      pvStack_178 = (void *)(long)iVar2;
      uStack_180 = 0;
      if (pvStack_178 == (void *)0x0) {
        return iVar2;
      }
      pcStack_190 = (code *)0x1b9c01;
      start_watcher_cold_2();
      pvVar1 = pvStack_178;
    }
    pvStack_178 = pvVar1;
    pcStack_190 = (code *)0x1b9c12;
    iVar2 = uv_signal_start(handle_01,signal_cb,signum);
    pvStack_178 = (void *)(long)iVar2;
    uStack_180 = 0;
    if (pvStack_178 == (void *)0x0) {
      return iVar2;
    }
  }
  else {
    pcStack_190 = (code *)0x1b9c48;
    start_watcher_cold_1();
  }
  handle_00 = (uv_signal_t *)&pvStack_178;
  iVar2 = (int)&uStack_180;
  pcStack_190 = signal_cb;
  start_watcher_cold_3();
  pcStack_190 = (code *)(long)iVar2;
  lStack_198 = (long)*(int *)&handle_00[1].data;
  if (pcStack_190 == (code *)lStack_198) {
    uVar3 = handle_00[-1].dispatched_signals + 1;
    handle_00[-1].dispatched_signals = uVar3;
    if (uVar3 != 10) {
      return uVar3;
    }
    if (handle_00[-1].caught_signals == 0) {
      uv_close((uv_handle_t *)handle_00,(uv_close_cb)0x0);
      return extraout_EAX;
    }
    if (handle_00[-1].caught_signals == 1) {
      iVar2 = uv_signal_stop(handle_00);
      return iVar2;
    }
  }
  else {
    pcStack_1a8 = (code *)0x1b9cb9;
    signal_cb_cold_1();
  }
  pcStack_1a8 = run_test_we_get_signals;
  signal_cb_cold_2();
  pcStack_1a8 = (code *)0x0;
  ptStack_500 = (timer_ctx *)0x1b9ccf;
  uStack_1b8 = (ulong)ppuVar8 & 0xffffffff;
  puStack_1b0 = handle_01;
  puVar4 = uv_default_loop();
  ptStack_500 = (timer_ctx *)0x1b9cec;
  start_watcher(puVar4,10,&sStack_3d8,0);
  ptStack_500 = (timer_ctx *)0x1b9d07;
  start_watcher(puVar4,10,&sStack_350,0);
  ptStack_500 = (timer_ctx *)0x1b9d1e;
  start_watcher(puVar4,0xc,&sStack_2c8,0);
  ptStack_500 = (timer_ctx *)0x1b9d35;
  start_watcher(puVar4,0xc,&sStack_240,0);
  ptStack_500 = (timer_ctx *)0x1b9d4a;
  start_timer(puVar4,10,&tStack_4e8);
  ptStack_500 = (timer_ctx *)0x1b9d5d;
  start_timer(puVar4,0xc,&tStack_460);
  ptStack_500 = (timer_ctx *)0x1b9d67;
  iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
  uStack_4f0 = (ulong)iVar2;
  uStack_4f8 = 0;
  if (uStack_4f0 != 0) goto LAB_001b9e51;
  lVar5 = 4;
  do {
    uStack_4f0 = (ulong)*(uint *)((long)&sStack_3d8.stop_or_close + lVar5);
    uStack_4f8 = 10;
    if (uStack_4f0 != 10) {
      ptStack_500 = (timer_ctx *)0x1b9e44;
      run_test_we_get_signals_cold_2();
      goto LAB_001b9e44;
    }
    lVar5 = lVar5 + 0x88;
  } while (lVar5 != 0x224);
  lVar5 = 0;
  do {
    uStack_4f0 = (ulong)*(uint *)((long)&tStack_4e8.ncalls + lVar5);
    uStack_4f8 = 10;
    if (uStack_4f0 != 10) goto LAB_001b9e44;
    lVar5 = lVar5 + 0x88;
  } while (lVar5 == 0x88);
  ptStack_500 = (timer_ctx *)0x1b9df7;
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  ptStack_500 = (timer_ctx *)0x1b9e01;
  uv_run(puVar4,UV_RUN_DEFAULT);
  uStack_4f0 = 0;
  ptStack_500 = (timer_ctx *)0x1b9e12;
  iVar2 = uv_loop_close(puVar4);
  uStack_4f8 = (ulong)iVar2;
  if (uStack_4f0 == uStack_4f8) {
    ptStack_500 = (timer_ctx *)0x1b9e28;
    uv_library_shutdown();
    return 0;
  }
  goto LAB_001b9e5e;
LAB_001b9e44:
  ptStack_500 = (timer_ctx *)0x1b9e51;
  run_test_we_get_signals_cold_3();
LAB_001b9e51:
  ptStack_500 = (timer_ctx *)0x1b9e5e;
  run_test_we_get_signals_cold_1();
LAB_001b9e5e:
  ptStack_500 = (timer_ctx *)run_test_we_get_signal_one_shot;
  run_test_we_get_signals_cold_4();
  puStack_508 = puVar4;
  ptStack_500 = &tStack_460;
  puVar4 = uv_default_loop();
  start_timer(puVar4,0x11,(timer_ctx *)(auStack_620 + 8));
  start_watcher(puVar4,0x11,&sStack_590,1);
  sStack_590.stop_or_close = NOOP;
  iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
  auStack_620._0_8_ = SEXT48(iVar2);
  pvStack_628 = (void *)0x0;
  if ((void *)auStack_620._0_8_ == (void *)0x0) {
    auStack_620._0_8_ = ZEXT48((uint)auStack_620._8_4_);
    pvStack_628 = (void *)0xa;
    if ((void *)auStack_620._0_8_ != (void *)0xa) goto LAB_001ba088;
    auStack_620._0_8_ = (void *)0x1;
    pvStack_628 = (void *)(ulong)sStack_590.ncalls;
    if (pvStack_628 != (void *)0x1) goto LAB_001ba097;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_620 + 8));
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_620._0_8_ = SEXT48(iVar2);
    pvStack_628 = (void *)0x0;
    if ((void *)auStack_620._0_8_ != (void *)0x0) goto LAB_001ba0a6;
    auStack_620._0_8_ = (void *)0x1;
    pvStack_628 = (void *)(ulong)sStack_590.ncalls;
    if (pvStack_628 != (void *)0x1) goto LAB_001ba0b5;
    sStack_590.stop_or_close = CLOSE;
    sStack_590.ncalls = 0;
    uv_signal_start_oneshot(&sStack_590.handle,signal_cb_one_shot,0x11);
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_620 + 8));
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_620._0_8_ = SEXT48(iVar2);
    pvStack_628 = (void *)0x0;
    if ((void *)auStack_620._0_8_ != (void *)0x0) goto LAB_001ba0c4;
    auStack_620._0_8_ = ZEXT48((uint)auStack_620._8_4_);
    pvStack_628 = (void *)0xa;
    if ((void *)auStack_620._0_8_ != (void *)0xa) goto LAB_001ba0d3;
    auStack_620._0_8_ = (void *)0x1;
    pvStack_628 = (void *)(ulong)sStack_590.ncalls;
    if (pvStack_628 != (void *)0x1) goto LAB_001ba0e2;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_620._0_8_ = (void *)0x0;
    iVar2 = uv_loop_close(puVar4);
    pvStack_628 = (void *)(long)iVar2;
    if ((void *)auStack_620._0_8_ == pvStack_628) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_we_get_signal_one_shot_cold_1();
LAB_001ba088:
    run_test_we_get_signal_one_shot_cold_2();
LAB_001ba097:
    run_test_we_get_signal_one_shot_cold_3();
LAB_001ba0a6:
    run_test_we_get_signal_one_shot_cold_4();
LAB_001ba0b5:
    run_test_we_get_signal_one_shot_cold_5();
LAB_001ba0c4:
    run_test_we_get_signal_one_shot_cold_6();
LAB_001ba0d3:
    run_test_we_get_signal_one_shot_cold_7();
LAB_001ba0e2:
    run_test_we_get_signal_one_shot_cold_8();
  }
  puVar9 = (uv_handle_t *)auStack_620;
  uVar3 = (uint)&pvStack_628;
  run_test_we_get_signal_one_shot_cold_9();
  if (uVar3 == puVar9[1].flags) {
    iVar2 = *(int *)&puVar9[-1].field_0x3c + 1;
    *(int *)&puVar9[-1].field_0x3c = iVar2;
    if (iVar2 == 1) {
      if (puVar9[-1].flags != 0) {
        return 1;
      }
      uv_close(puVar9,(uv_close_cb)0x0);
      return extraout_EAX_00;
    }
  }
  else {
    signal_cb_one_shot_cold_1();
  }
  signal_cb_one_shot_cold_2();
  puStack_678 = puVar4;
  puVar4 = uv_default_loop();
  start_timer(puVar4,0x11,(timer_ctx *)(auStack_930 + 8));
  start_watcher(puVar4,0x11,(signal_ctx *)auStack_8a0,1);
  start_watcher(puVar4,0x11,(signal_ctx *)auStack_818,1);
  auStack_8a0._0_4_ = CLOSE;
  auStack_818._0_4_ = CLOSE;
  iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
  auStack_930._0_8_ = SEXT48(iVar2);
  if ((void *)auStack_930._0_8_ == (void *)0x0) {
    auStack_930._0_8_ = ZEXT48((uint)auStack_930._8_4_);
    if ((void *)auStack_930._0_8_ != (void *)0xa) goto LAB_001ba820;
    auStack_930._0_8_ = (void *)0x1;
    if (auStack_8a0._4_4_ != 1) goto LAB_001ba82f;
    auStack_930._0_8_ = (void *)0x1;
    if (auStack_818._4_4_ != 1) goto LAB_001ba83e;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_930 + 8));
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_8a0,1);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_818,1);
    auStack_8a0._0_4_ = CLOSE;
    auStack_818._0_4_ = CLOSE;
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_790,0);
    uv_close((uv_handle_t *)(auStack_790 + 8),(uv_close_cb)0x0);
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_930._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_930._0_8_ != (void *)0x0) goto LAB_001ba84d;
    auStack_930._0_8_ = ZEXT48((uint)auStack_930._8_4_);
    if ((void *)auStack_930._0_8_ != (void *)0xa) goto LAB_001ba85c;
    auStack_930._0_8_ = (void *)0x1;
    if (auStack_8a0._4_4_ != 1) goto LAB_001ba86b;
    auStack_930._0_8_ = (void *)0x1;
    if (auStack_818._4_4_ != 1) goto LAB_001ba87a;
    auStack_930._0_8_ = ZEXT48((uint)auStack_790._4_4_);
    if ((void *)auStack_930._0_8_ != (void *)0x0) goto LAB_001ba889;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_930 + 8));
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_8a0,0);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_818,0);
    auStack_8a0._0_4_ = CLOSE;
    auStack_818._0_4_ = CLOSE;
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_790,1);
    uv_close((uv_handle_t *)(auStack_790 + 8),(uv_close_cb)0x0);
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_930._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_930._0_8_ != (void *)0x0) goto LAB_001ba898;
    auStack_930._0_8_ = ZEXT48((uint)auStack_930._8_4_);
    if ((void *)auStack_930._0_8_ != (void *)0xa) goto LAB_001ba8a7;
    auStack_930._0_8_ = ZEXT48((uint)auStack_8a0._4_4_);
    if ((void *)auStack_930._0_8_ != (void *)0xa) goto LAB_001ba8b6;
    auStack_930._0_8_ = ZEXT48((uint)auStack_818._4_4_);
    if ((void *)auStack_930._0_8_ != (void *)0xa) goto LAB_001ba8c5;
    auStack_930._0_8_ = ZEXT48((uint)auStack_790._4_4_);
    if ((void *)auStack_930._0_8_ != (void *)0x0) goto LAB_001ba8d4;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_930 + 8));
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_8a0,0);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_818,0);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_790,1);
    start_watcher(puVar4,0x11,&sStack_708,1);
    auStack_790._0_4_ = CLOSE;
    sStack_708.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_8a0 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_818 + 8),(uv_close_cb)0x0);
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_930._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_930._0_8_ != (void *)0x0) goto LAB_001ba8e3;
    auStack_930._0_8_ = ZEXT48((uint)auStack_930._8_4_);
    if ((void *)auStack_930._0_8_ != (void *)0xa) goto LAB_001ba8f2;
    auStack_930._0_8_ = ZEXT48((uint)auStack_8a0._4_4_);
    if ((void *)auStack_930._0_8_ != (void *)0x0) goto LAB_001ba901;
    auStack_930._0_8_ = ZEXT48((uint)auStack_818._4_4_);
    if ((void *)auStack_930._0_8_ != (void *)0x0) goto LAB_001ba910;
    auStack_930._0_8_ = (void *)0x1;
    if (auStack_790._4_4_ != 1) goto LAB_001ba91f;
    auStack_930._0_8_ = (void *)0x1;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_930 + 8));
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_8a0,0);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_818,1);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_790,0);
    start_watcher(puVar4,0x11,&sStack_708,0);
    sStack_708.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_8a0 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_790 + 8),(uv_close_cb)0x0);
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_930._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_930._0_8_ != (void *)0x0) goto LAB_001ba93d;
    auStack_930._0_8_ = ZEXT48((uint)auStack_930._8_4_);
    if ((void *)auStack_930._0_8_ != (void *)0xa) goto LAB_001ba94c;
    auStack_930._0_8_ = ZEXT48((uint)auStack_8a0._4_4_);
    if ((void *)auStack_930._0_8_ != (void *)0x0) goto LAB_001ba95b;
    auStack_930._0_8_ = (void *)0x1;
    if (auStack_818._4_4_ != 1) goto LAB_001ba96a;
    auStack_930._0_8_ = ZEXT48((uint)auStack_790._4_4_);
    if ((void *)auStack_930._0_8_ != (void *)0x0) goto LAB_001ba979;
    auStack_930._0_8_ = ZEXT48(sStack_708.ncalls);
    if ((void *)auStack_930._0_8_ == (void *)0xa) {
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      auStack_930._0_8_ = (void *)0x0;
      iVar2 = uv_loop_close(puVar4);
      if ((void *)auStack_930._0_8_ == (void *)(long)iVar2) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ba997;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_001ba820:
    run_test_we_get_signals_mixed_cold_2();
LAB_001ba82f:
    run_test_we_get_signals_mixed_cold_3();
LAB_001ba83e:
    run_test_we_get_signals_mixed_cold_4();
LAB_001ba84d:
    run_test_we_get_signals_mixed_cold_5();
LAB_001ba85c:
    run_test_we_get_signals_mixed_cold_6();
LAB_001ba86b:
    run_test_we_get_signals_mixed_cold_7();
LAB_001ba87a:
    run_test_we_get_signals_mixed_cold_8();
LAB_001ba889:
    run_test_we_get_signals_mixed_cold_9();
LAB_001ba898:
    run_test_we_get_signals_mixed_cold_10();
LAB_001ba8a7:
    run_test_we_get_signals_mixed_cold_11();
LAB_001ba8b6:
    run_test_we_get_signals_mixed_cold_12();
LAB_001ba8c5:
    run_test_we_get_signals_mixed_cold_13();
LAB_001ba8d4:
    run_test_we_get_signals_mixed_cold_14();
LAB_001ba8e3:
    run_test_we_get_signals_mixed_cold_15();
LAB_001ba8f2:
    run_test_we_get_signals_mixed_cold_16();
LAB_001ba901:
    run_test_we_get_signals_mixed_cold_17();
LAB_001ba910:
    run_test_we_get_signals_mixed_cold_18();
LAB_001ba91f:
    run_test_we_get_signals_mixed_cold_19();
    run_test_we_get_signals_mixed_cold_20();
LAB_001ba93d:
    run_test_we_get_signals_mixed_cold_21();
LAB_001ba94c:
    run_test_we_get_signals_mixed_cold_22();
LAB_001ba95b:
    run_test_we_get_signals_mixed_cold_23();
LAB_001ba96a:
    run_test_we_get_signals_mixed_cold_24();
LAB_001ba979:
    run_test_we_get_signals_mixed_cold_25();
  }
  run_test_we_get_signals_mixed_cold_26();
LAB_001ba997:
  puVar9 = (uv_handle_t *)auStack_930;
  run_test_we_get_signals_mixed_cold_27();
  iVar2 = uv_is_closing(puVar9);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close(puVar9,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(we_get_signal) {
  struct signal_ctx sc;
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, &sc, 0);
  sc.stop_or_close = STOP; /* stop, don't close the signal handle */
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc.ncalls, NSIGNALS);

  start_timer(loop, SIGCHLD, &tc);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc.ncalls, NSIGNALS);

  sc.ncalls = 0;
  sc.stop_or_close = CLOSE; /* now close it when it's done */
  uv_signal_start(&sc.handle, signal_cb, SIGCHLD);

  start_timer(loop, SIGCHLD, &tc);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc.ncalls, NSIGNALS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}